

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

int __thiscall QTabBarPrivate::init(QTabBarPrivate *this,EVP_PKEY_CTX *ctx)

{
  TextElideMode TVar1;
  int iVar2;
  QTabBar *pQVar3;
  QWidget *parent;
  QToolButton *pQVar4;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  QTabBar *q;
  QString *in_stack_fffffffffffffe88;
  code *name;
  QObject *in_stack_fffffffffffffe90;
  QObject *this_00;
  QWidget *this_01;
  QToolButton *in_stack_fffffffffffffea0;
  QToolButton *this_02;
  char16_t *str;
  code *this_03;
  Object *in_stack_fffffffffffffee8;
  Object *receiverPrivate;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar6;
  Function in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff20;
  undefined4 uVar7;
  undefined1 local_58 [40];
  undefined8 uStack_30;
  Connection local_28;
  char16_t local_20 [12];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(this);
  parent = (QWidget *)operator_new(0x28);
  QToolButton::QToolButton(in_stack_fffffffffffffea0,parent);
  this->leftB = (QToolButton *)parent;
  this_02 = this->leftB;
  str = local_20;
  Qt::Literals::StringLiterals::operator____s(str,(size_t)this_02);
  QObject::setObjectName<void>(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  QString::~QString((QString *)0x6a91cc);
  uVar6 = 1;
  QAbstractButton::setAutoRepeat(&this_02->super_QAbstractButton,SUB81((ulong)parent >> 0x38,0));
  this_03 = scrollTabs;
  local_58._32_8_ = scrollTabs;
  uStack_30 = 0;
  name = scrollTabs;
  this_00 = (QObject *)0x0;
  uVar7 = 0;
  QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QTabBarPrivate::*)()>
            ((Object *)CONCAT44(uVar6,in_stack_fffffffffffffef0),(ulong)in_stack_ffffffffffffff20,
             in_stack_fffffffffffffee8,in_stack_ffffffffffffff10,AutoConnection);
  QMetaObject::Connection::~Connection(&local_28);
  QWidget::hide((QWidget *)0x6a9291);
  pQVar4 = (QToolButton *)operator_new(0x28);
  QToolButton::QToolButton(this_02,parent);
  this->rightB = pQVar4;
  Qt::Literals::StringLiterals::operator____s(str,(size_t)this_02);
  QObject::setObjectName<void>(this_00,(QString *)name);
  QString::~QString((QString *)0x6a9307);
  QAbstractButton::setAutoRepeat(&this_02->super_QAbstractButton,SUB81((ulong)parent >> 0x38,0));
  this_01 = (QWidget *)0x0;
  receiverPrivate = (Object *)local_58;
  QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QTabBarPrivate::*)()>
            ((Object *)CONCAT44(uVar6,in_stack_fffffffffffffef0),
             CONCAT44(uVar7,in_stack_ffffffffffffff20),receiverPrivate,in_stack_ffffffffffffff10,
             (ConnectionType)((ulong)this_03 >> 0x20));
  QMetaObject::Connection::~Connection((Connection *)receiverPrivate);
  QWidget::hide((QWidget *)0x6a93b6);
  QWidget::setFocusPolicy(this_01,(FocusPolicy)((ulong)this_03 >> 0x20));
  QTabBar::tr((char *)parent,(char *)this_01,(int)((ulong)this_03 >> 0x20));
  QWidget::setAccessibleName(parent,(QString *)this_01);
  QString::~QString((QString *)0x6a942a);
  QTabBar::tr((char *)parent,(char *)this_01,(int)((ulong)this_03 >> 0x20));
  QWidget::setAccessibleName(parent,(QString *)this_01);
  QString::~QString((QString *)0x6a948e);
  QWidget::setSizePolicy(this_01,(Policy)((ulong)this_03 >> 0x20),(Policy)this_03);
  pQVar5 = QWidget::style((QWidget *)this_03);
  TVar1 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x43,uVar7,pQVar3);
  this->elideMode = TVar1;
  pQVar5 = QWidget::style((QWidget *)this_03);
  iVar2 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x26,uVar7,pQVar3);
  *(ushort *)&this->field_0x2d0 =
       ((ushort)*(undefined4 *)&this->field_0x2d0 & 0xfff7) + (ushort)(iVar2 == 0) * 8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTabBarPrivate::init()
{
    Q_Q(QTabBar);
    leftB = new QToolButton(q);
    leftB->setObjectName(u"ScrollLeftButton"_s);
    leftB->setAutoRepeat(true);
    QObjectPrivate::connect(leftB, &QToolButton::clicked,
                            this, &QTabBarPrivate::scrollTabs);
    leftB->hide();
    rightB = new QToolButton(q);
    rightB->setObjectName(u"ScrollRightButton"_s);
    rightB->setAutoRepeat(true);
    QObjectPrivate::connect(rightB, &QToolButton::clicked,
                            this, &QTabBarPrivate::scrollTabs);
    rightB->hide();
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled()) {
        leftB->setFocusPolicy(Qt::NoFocus);
        rightB->setFocusPolicy(Qt::NoFocus);
        q->setFocusPolicy(Qt::NoFocus);
    } else
#endif
        q->setFocusPolicy(Qt::TabFocus);

#if QT_CONFIG(accessibility)
    leftB->setAccessibleName(QTabBar::tr("Scroll Left"));
    rightB->setAccessibleName(QTabBar::tr("Scroll Right"));
#endif
    q->setSizePolicy(QSizePolicy::Preferred, QSizePolicy::Fixed);
    elideMode = Qt::TextElideMode(q->style()->styleHint(QStyle::SH_TabBar_ElideMode, nullptr, q));
    useScrollButtons = !q->style()->styleHint(QStyle::SH_TabBar_PreferNoArrows, nullptr, q);
}